

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O2

size_t zmMontCreate_deep(size_t no)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong n;
  
  n = no + 7 >> 3;
  sVar1 = zzMod_deep(n,n);
  sVar2 = zmMulMont_deep(n);
  sVar3 = zmSqrMont_deep(n);
  sVar4 = zzAlmostInvMod_deep(n);
  sVar5 = zmDivMont_deep(n);
  sVar1 = utilMax(5,sVar1,sVar2,sVar3,sVar4,sVar5);
  return sVar1;
}

Assistant:

size_t zmMontCreate_deep(size_t no)
{
	const size_t n = W_OF_O(no);
	return utilMax(5,
		zzMod_deep(n, n),
		zmMulMont_deep(n),
		zmSqrMont_deep(n),
		zmInvMont_deep(n),
		zmDivMont_deep(n));
}